

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_deserialize_struct
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,string *prefix,bool pointer)

{
  bool bVar1;
  ostream *poVar2;
  reference pptVar3;
  string *psVar4;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a0;
  t_field **local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_50;
  undefined1 local_29;
  string *psStack_28;
  bool pointer_local;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_29 = pointer;
  psStack_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  if (pointer) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"if (!");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,") { ");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar2 = std::operator<<(poVar2,"  ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2," = ::std::shared_ptr<");
    type_name_abi_cxx11_(&local_50,this,(t_type *)prefix_local,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,">(new ");
    type_name_abi_cxx11_((string *)&members,this,(t_type *)prefix_local,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&members);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&members);
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar2 = std::operator<<(poVar2,"xfer += ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"->read(iprot);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar2 = std::operator<<(poVar2,"bool wasSet = false;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    f_iter._M_current = (t_field **)t_struct::get_members((t_struct *)prefix_local);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_90);
    local_98 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_90._M_current = local_98;
    while( true ) {
      local_a0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_90,&local_a0);
      if (!bVar1) break;
      poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar2 = std::operator<<(poVar2,"if (");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"->__isset.");
      pptVar3 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_90);
      psVar4 = t_field::get_name_abi_cxx11_(*pptVar3);
      poVar2 = std::operator<<(poVar2,(string *)psVar4);
      poVar2 = std::operator<<(poVar2,") { wasSet = true; }");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_90);
    }
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar2 = std::operator<<(poVar2,"if (!wasSet) { ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".reset(); }");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"xfer += ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".read(iprot);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  string prefix,
                                                  bool pointer) {
  if (pointer) {
    indent(out) << "if (!" << prefix << ") { " << endl;
    indent(out) << "  " << prefix << " = ::std::shared_ptr<" << type_name(tstruct) << ">(new "
                << type_name(tstruct) << ");" << endl;
    indent(out) << "}" << endl;
    indent(out) << "xfer += " << prefix << "->read(iprot);" << endl;
    indent(out) << "bool wasSet = false;" << endl;
    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {

      indent(out) << "if (" << prefix << "->__isset." << (*f_iter)->get_name()
                  << ") { wasSet = true; }" << endl;
    }
    indent(out) << "if (!wasSet) { " << prefix << ".reset(); }" << endl;
  } else {
    indent(out) << "xfer += " << prefix << ".read(iprot);" << endl;
  }
}